

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stpncpy_s.c
# Opt level: O0

char * stpncpy_s(char *dest,rsize_t dmax,char *src,rsize_t smax,errno_t *err)

{
  long lVar1;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined4 *in_R8;
  long in_FS_OFFSET;
  char *filler_1;
  char *filler;
  char *orig_dest;
  rsize_t orig_dmax;
  undefined4 in_stack_ffffffffffffff98;
  errno_t in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *pcVar2;
  char *local_50;
  ulong local_30;
  char *local_28;
  ulong local_20;
  char *local_18;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *in_R8 = 400;
    local_10 = (char *)0x0;
  }
  else if (in_RDX == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *in_R8 = 400;
    *in_RDI = '\0';
    local_10 = (char *)0x0;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *in_R8 = 0x191;
    local_10 = (char *)0x0;
  }
  else if (in_RSI < 0x10000001) {
    if (in_RCX < 0x10000001) {
      if (in_RSI < in_RCX + 1) {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        *in_R8 = 0x196;
        *in_RDI = '\0';
        local_10 = (char *)0x0;
      }
      else if ((in_RDX < in_RDI) && (in_RDI <= in_RDX + in_RCX)) {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        *in_R8 = 0x194;
        *in_RDI = '\0';
        local_10 = (char *)0x0;
      }
      else if ((in_RDI < in_RDX) && (in_RDX <= in_RDI + in_RCX)) {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        *in_R8 = 0x194;
        *in_RDI = '\0';
        local_10 = (char *)0x0;
      }
      else if (in_RDX == (char *)0x0) {
        *in_RDI = '\0';
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        *in_R8 = 400;
        local_10 = (char *)0x0;
      }
      else {
        local_30 = in_RCX;
        local_28 = in_RDX;
        local_20 = in_RSI;
        local_18 = in_RDI;
        if (in_RDI == in_RDX) {
          while (local_20 != 0) {
            if (*local_18 == '\0') {
              local_50 = local_18;
              for (; local_30 != 0; local_30 = local_30 - 1) {
                *local_50 = '\0';
                local_50 = local_50 + 1;
              }
              *in_R8 = 0;
              local_10 = local_18;
              goto LAB_00107e46;
            }
            local_20 = local_20 - 1;
            local_18 = local_18 + 1;
            local_30 = local_30 - 1;
            if (local_30 == 0) {
              *local_18 = '\0';
            }
          }
          handle_error(in_stack_ffffffffffffffa8,(rsize_t)in_stack_ffffffffffffffa0,
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
          *in_R8 = 0x196;
          local_10 = (char *)0x0;
        }
        else {
          for (; local_20 != 0; local_20 = local_20 - 1) {
            *local_18 = *local_28;
            if (local_30 == 0) {
              *local_18 = '\0';
            }
            pcVar2 = local_18;
            if (*local_18 == '\0') goto LAB_00107d87;
            local_30 = local_30 - 1;
            local_18 = local_18 + 1;
            local_28 = local_28 + 1;
          }
          handle_error(in_stack_ffffffffffffffa8,(rsize_t)in_stack_ffffffffffffffa0,
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
          *in_R8 = 0x196;
          local_10 = (char *)0x0;
        }
      }
    }
    else {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      *in_R8 = 0x193;
      local_10 = (char *)0x0;
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *in_R8 = 0x193;
    local_10 = (char *)0x0;
  }
LAB_00107e46:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
LAB_00107d87:
  for (; local_30 != 0; local_30 = local_30 - 1) {
    *pcVar2 = '\0';
    pcVar2 = pcVar2 + 1;
  }
  *in_R8 = 0;
  local_10 = local_18;
  goto LAB_00107e46;
}

Assistant:

char *
stpncpy_s(char *dest, rsize_t dmax, const char *src, rsize_t smax, errno_t *err)
{
    rsize_t orig_dmax;
    char *orig_dest;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("stpncpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        dest[0] = '\0';
        return NULL;
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax is 0",
                   NULL, ESZEROL);
        *err = RCNEGATE(ESZEROL);
        return NULL;
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (smax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("stpncpy_s: smax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (dmax < (smax+1)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax too short for smax",
                   NULL, ESNOSPC);
        *err = RCNEGATE(ESNOSPC);
        dest[0] = '\0';
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into destination */
    if ((src < dest) && ((src+smax) >= dest)) {
        invoke_safe_str_constraint_handler("stpncpy_s: src+smax overlaps into dest",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        dest[0] = '\0';
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into source */
    if ((dest < src) && ((dest+smax) >= src)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest+smax overlaps into src",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        dest[0] = '\0';
        return NULL;
    }

#ifdef SAFECLIB_STR_NULL_SLACK
    /* dmwheel1: Add check to prevent destruction of overlap into destination */
    if ((src < dest) && ((src+dmax) >= dest)) {
        invoke_safe_str_constraint_handler("stpncpy_s: src+dmax overlaps into dest",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into source */
    if ((dest < src) && ((dest+dmax) >= src)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest+dmax overlaps into src",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        return NULL;
    }
#endif


    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }
#else
        *dest = '\0';
#endif
        invoke_safe_str_constraint_handler("stpncpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest == src) {
        /* look for the terminating null character, or return err if not found in dmax bytes */
        while (dmax > 0) {
            if (*dest == '\0') {
                /* add nulls to complete smax */
                char *filler = dest; /* don't change dest, because we need to return it */
                while (smax) { *filler = '\0'; dmax--; smax--; filler++; }
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null dmax slack to clear any data */
                while (dmax) { *filler = '\0'; dmax--; filler++; }
#endif
                *err = RCNEGATE(EOK);
                return dest;
            }
            dmax--;
            dest++;
            if (--smax == 0) {
                /* we have copied smax characters, add null terminator */
                *dest = '\0';
            }
        }
        /* null terminator not found in src before end of dmax */
        handle_error(orig_dest, orig_dmax, "stpncpy_s: not enough space for src",
                         ESNOSPC);
        *err = RCNEGATE(ESNOSPC);
        return NULL;
    }


    /* All checks for buffer overlaps were made, just do the copies */
    while (dmax > 0) {

        *dest = *src; /* Copy the data into the destination */

        /* Check for maximum copy from source */
        if (smax == 0) {
            /* we have copied smax characters, add null terminator */
            *dest = '\0';
        }

        /* Check for end of copying */
        if (*dest == '\0') {
            /* add nulls to complete smax, if fewer than smax characters
             * were in src when the NULL was encountered */
            char *filler = dest; /* don't change dest, because we need to return it */
            while (smax) { *filler = '\0'; dmax--; smax--; filler++; }
#ifdef SAFECLIB_STR_NULL_SLACK
            /* null dmax slack to clear any data */
            while (dmax) { *filler = '\0'; dmax--; filler++; }
#endif
            *err = RCNEGATE(EOK);
            return dest;
        }
        dmax--;
        smax--;
        dest++;
        src++;

    }
    /*
     * Ran out of space in dest, and did not find the null terminator in src
     */
    handle_error(orig_dest, orig_dmax, "stpncpy_s: not enough space for src",
                 ESNOSPC);
    *err = RCNEGATE(ESNOSPC);
    return NULL;
}